

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O3

void __thiscall Hpipe::CharItem::write_dot_rec(CharItem *this,ostream *os)

{
  pointer pCVar1;
  ostream *poVar2;
  int iVar3;
  CharEdge *t;
  pointer pCVar4;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    std::__ostream_insert<char,std::char_traits<char>>(os,"  node_",7);
    poVar2 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," [label=\"",9);
    dot_out<Hpipe::CharItem>(os,this,-1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"];\n",3);
    pCVar4 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
             super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
             super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar4 != pCVar1) {
      iVar3 = 0;
      do {
        if (pCVar4->item != (CharItem *)0x0) {
          write_dot_rec(pCVar4->item,os);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  node_",7);
        poVar2 = std::ostream::_M_insert<void_const*>(os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> node_",9);
        std::ostream::_M_insert<void_const*>(poVar2);
        if (0x10 < (ulong)((long)(this->edges).
                                 super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                                 super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->edges).
                                super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                                super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::__ostream_insert<char,std::char_traits<char>>(os," [label=\"",9);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"]",2);
          iVar3 = iVar3 + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,";\n",2);
        pCVar4 = pCVar4 + 1;
      } while (pCVar4 != pCVar1);
    }
  }
  return;
}

Assistant:

void CharItem::write_dot_rec( std::ostream &os ) const {
    if ( op_id == CharItem::cur_op_id )
        return;
    op_id = CharItem::cur_op_id;

    os << "  node_" << this << " [label=\"";
    dot_out( os, *this );
    os << "\"";
    //if ( leads_to_ok )
    //    os << ",style=dotted";
    os << "];\n";

    int cpt = 0;
    for( const CharEdge &t : edges ) {
        if ( t.item )
            t.item->write_dot_rec( os );
        os << "  node_" << this << " -> node_" << t.item;
        if ( this->edges.size() >= 2 )
            os << " [label=\"" << cpt++ << "\"]";
        os << ";\n";
    }
}